

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::BackgroundMark(Recycler *this)

{
  code *pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  bool bVar8;
  undefined4 *puVar9;
  size_t sVar10;
  
  bVar8 = DoQueueTrackedObject(this);
  if (!bVar8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1558,"(this->DoQueueTrackedObject())","this->DoQueueTrackedObject()");
    if (!bVar8) goto LAB_007144d9;
    *puVar9 = 0;
  }
  this->backgroundRescanCount = '\0';
  DoBackgroundParallelMark(this);
  if ((this->needOOMRescan == false) && (this->isAborting == false)) {
    sVar10 = (this->collectionStats).markData.rescanPageCount;
    sVar2 = (this->collectionStats).markData.rescanObjectCount;
    sVar3 = (this->collectionStats).markData.rescanObjectByteCount;
    sVar4 = (this->collectionStats).markData.rescanLargePageCount;
    sVar5 = (this->collectionStats).markData.rescanLargeObjectCount;
    sVar6 = (this->collectionStats).markData.rescanLargeByteCount;
    sVar7 = (this->collectionStats).markData.markBytes;
    (this->collectionStats).backgroundMarkData[0].markCount =
         (this->collectionStats).markData.markCount;
    (this->collectionStats).backgroundMarkData[0].markBytes = sVar7;
    (this->collectionStats).backgroundMarkData[0].rescanLargeObjectCount = sVar5;
    (this->collectionStats).backgroundMarkData[0].rescanLargeByteCount = sVar6;
    (this->collectionStats).backgroundMarkData[0].rescanObjectByteCount = sVar3;
    (this->collectionStats).backgroundMarkData[0].rescanLargePageCount = sVar4;
    (this->collectionStats).backgroundMarkData[0].rescanPageCount = sVar10;
    (this->collectionStats).backgroundMarkData[0].rescanObjectCount = sVar2;
    bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,BackgroundRepeatMarkPhase);
    if ((!bVar8) &&
       ((sVar10 = BackgroundRepeatMark(this), this->needOOMRescan == false &&
        (this->isAborting == false)))) {
      if (sVar10 == 0xffffffffffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x1574,"(rescannedPageCount != Recycler::InvalidScanRootBytes)",
                           "rescannedPageCount != Recycler::InvalidScanRootBytes");
        if (!bVar8) {
LAB_007144d9:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar9 = 0;
      }
      else if (sVar10 < 0x80) {
        return;
      }
      BackgroundRepeatMark(this);
      return;
    }
  }
  return;
}

Assistant:

void
Recycler::BackgroundMark()
{
    Assert(this->DoQueueTrackedObject());
    this->backgroundRescanCount = 0;

    this->DoBackgroundParallelMark();

    if (this->NeedOOMRescan() || this->isAborting)
    {
        return;
    }

#ifdef RECYCLER_STATS
    this->collectionStats.backgroundMarkData[0] = this->collectionStats.markData;
#endif

    if (PHASE_OFF1(Js::BackgroundRepeatMarkPhase))
    {
        return;
    }

    // We always do one repeat mark pass.
    size_t rescannedPageCount = this->BackgroundRepeatMark();

    if (this->NeedOOMRescan() || this->isAborting)
    {
        // OOM'ed. Let's not continue
        return;
    }

    Assert(rescannedPageCount != Recycler::InvalidScanRootBytes);

    // If we rescanned enough pages in the previous repeat mark pass, then do one more
    // to try to reduce the amount of work we need to do in-thread
    if (rescannedPageCount >= RecyclerHeuristic::BackgroundSecondRepeatMarkThreshold)
    {
        this->BackgroundRepeatMark();

        if (this->NeedOOMRescan() || this->isAborting)
        {
            // OOM'ed. Let's not continue
            return;
        }
    }
}